

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-cat.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  size_t __ptr;
  undefined4 uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int local_55c;
  ulong uStack_558;
  int j;
  size_t i;
  BigArrayIter iter;
  char str [300];
  undefined1 local_300 [8];
  BigArray array;
  ptrdiff_t offset;
  BigBlockPtr ptrnew;
  BigBlockPtr ptr;
  size_t chunksize;
  ptrdiff_t end;
  char *fmt;
  size_t buffersize;
  ptrdiff_t size;
  ptrdiff_t start;
  int humane;
  int opt;
  BigBlock bb;
  BigFile bf;
  char **argv_local;
  int argc_local;
  
  memset(&bb.dirty,0,8);
  memset(&humane,0,0x50);
  start._0_4_ = 1;
  size = 0;
  buffersize = 0xffffffffffffffff;
  fmt = (char *)0x10000000;
  end = 0;
  while (start._4_4_ = getopt(argc,argv,"bo:c:B:f:"), start._4_4_ != -1) {
    switch(start._4_4_) {
    case 0x42:
      __isoc99_sscanf(_optarg,"%td",&fmt);
      break;
    default:
      usage();
      break;
    case 0x62:
      start._0_4_ = 0;
      break;
    case 99:
      __isoc99_sscanf(_optarg,"%td",&buffersize);
      break;
    case 0x66:
      end = _optarg;
      break;
    case 0x6f:
      __isoc99_sscanf(_optarg,"%td",&size);
    }
  }
  if (argc - _optind != 2) {
    usage();
  }
  iVar7 = _optind + -1;
  iVar3 = big_file_open((BigFile *)&bb.dirty,argv[(long)iVar7 + 1]);
  pFVar1 = _stderr;
  if (iVar3 != 0) {
    pcVar6 = argv[(long)iVar7 + 1];
    pcVar4 = big_file_get_error_message();
    fprintf(pFVar1,"failed to open: %s: %s\n",pcVar6,pcVar4);
    exit(1);
  }
  iVar3 = big_file_open_block((BigFile *)&bb.dirty,(BigBlock *)&humane,argv[(long)iVar7 + 2]);
  pFVar1 = _stderr;
  if (iVar3 != 0) {
    pcVar6 = argv[(long)iVar7 + 2];
    pcVar4 = big_file_get_error_message();
    fprintf(pFVar1,"failed to open: %s: %s\n",pcVar6,pcVar4);
    exit(1);
  }
  if ((buffersize == 0xffffffffffffffff) || (bb.basename < (char *)(buffersize + size))) {
    buffersize = (long)bb.basename - size;
  }
  count = buffersize;
  signal(10,usr1);
  uVar2 = bb.dtype._0_4_;
  pcVar6 = fmt;
  lVar5 = size + buffersize;
  iVar3 = big_file_dtype_itemsize((char *)&humane);
  ptr.aoffset = (ulong)pcVar6 / (ulong)(long)(uVar2 * iVar3);
  array.data = (void *)size;
  while( true ) {
    if (lVar5 <= (long)array.data) {
      big_block_close((BigBlock *)&humane);
      big_file_close((BigFile *)&bb.dirty);
      return 0;
    }
    if (buffersize < (ulong)ptr.aoffset) {
      ptr.aoffset = buffersize;
    }
    iVar3 = big_block_read_simple
                      ((BigBlock *)&humane,(ptrdiff_t)array.data,ptr.aoffset,(BigArray *)local_300,
                       (char *)0x0);
    __ptr = array.size;
    pFVar1 = _stderr;
    if (iVar3 != 0) break;
    if ((int)start == 0) {
      iVar3 = big_file_dtype_itemsize((char *)&humane);
      fwrite((void *)__ptr,(long)iVar3,array.strides[0x1f],_stdout);
    }
    else {
      big_array_iter_init((BigArrayIter *)&i,(BigArray *)local_300);
      for (uStack_558 = 0; uStack_558 < (ulong)array._8_8_; uStack_558 = uStack_558 + 1) {
        for (local_55c = 0; local_55c < (int)bb.dtype._0_4_; local_55c = local_55c + 1) {
          big_file_dtype_format
                    ((char *)&iter.dataptr,local_300 + 4,(void *)iter._264_8_,(char *)end);
          big_array_iter_advance((BigArrayIter *)&i);
          fprintf(_stdout,"%s ",&iter.dataptr);
        }
        fprintf(_stdout,"\n");
      }
    }
    free((void *)array.size);
    array.data = (void *)(array._8_8_ + (long)array.data);
    countin = array._8_8_ + countin;
  }
  pcVar6 = big_file_get_error_message();
  fprintf(pFVar1,"failed to read original: %s\n",pcVar6);
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};
    int opt;

    int humane = 1; /* binary or ascii */
    ptrdiff_t start = 0;
    ptrdiff_t size = -1;

    size_t buffersize = 256 * 1024 * 1024;

    char * fmt = NULL;

    while(-1 != (opt = getopt(argc, argv, "bo:c:B:f:"))) {
        switch(opt) {
            case 'f':
                fmt = optarg;
                break;
            case 'b':
                humane = 0;
                break;
            case 'o':
                sscanf(optarg, "%td", &start);
                break;
            case 'c':
                sscanf(optarg, "%td", &size);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            default:
                usage();
        }
    }
    if(argc - optind != 2) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    if(size == -1 || bb.size < size + start) {
        size = bb.size - start;
    } 

    count = size;

    signal(SIGUSR1, usr1);

    ptrdiff_t end = start + size;

    size_t chunksize = buffersize / (bb.nmemb * big_file_dtype_itemsize(bb.dtype));
    BigBlockPtr ptr;
    BigBlockPtr ptrnew;
    ptrdiff_t offset;
    BigArray array;

    for(offset = start; offset < end; ) {
        if(chunksize > size) chunksize = size;
        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            exit(1);
        }

        if(!humane) {
            fwrite(array.data, big_file_dtype_itemsize(bb.dtype), array.size, stdout);
        } else {
            char str[300];
            BigArrayIter iter;
            big_array_iter_init(&iter, &array);
            size_t i;
            for(i = 0; i < array.dims[0]; i++) {
                int j;
                for(j = 0; j < bb.nmemb; j ++) {
                    big_file_dtype_format(str, array.dtype, iter.dataptr, fmt);
                    big_array_iter_advance(&iter);
                    fprintf(stdout, "%s ", str);
                }
                fprintf(stdout, "\n");
            }
        }
        free(array.data);
        offset += array.dims[0];
        countin += array.dims[0];
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}